

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

int lzham::lzham_lib_z_uncompress
              (uchar *pDest,lzham_z_ulong *pDest_len,uchar *pSource,lzham_z_ulong source_len)

{
  ulong in_RCX;
  ulong *in_RSI;
  int status;
  lzham_z_stream stream;
  lzham_z_streamp in_stack_ffffffffffffff58;
  int local_a0;
  undefined1 local_98 [8];
  int local_90;
  undefined4 local_78;
  undefined4 local_70;
  int in_stack_ffffffffffffff94;
  lzham_z_streamp in_stack_ffffffffffffff98;
  int local_4;
  
  memset(local_98,0,0x70);
  if ((in_RCX | *in_RSI) < 0x100000000) {
    local_90 = (int)in_RCX;
    local_78 = (undefined4)*in_RSI;
    local_4 = lzham_lib_z_inflateInit((lzham_z_streamp)0x108f54);
    if (local_4 == 0) {
      local_a0 = lzham_lib_z_inflate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      if (local_a0 == 1) {
        *in_RSI = CONCAT44(in_stack_ffffffffffffff94,local_70);
        local_4 = lzham_lib_z_inflateEnd(in_stack_ffffffffffffff58);
      }
      else {
        lzham_lib_z_inflateEnd(in_stack_ffffffffffffff58);
        if ((local_a0 == -5) && (local_90 == 0)) {
          local_a0 = -3;
        }
        local_4 = local_a0;
      }
    }
  }
  else {
    local_4 = -10000;
  }
  return local_4;
}

Assistant:

int LZHAM_CDECL lzham_lib_z_uncompress(unsigned char *pDest, lzham_z_ulong *pDest_len, const unsigned char *pSource, lzham_z_ulong source_len)
   {
      lzham_z_stream stream;
      int status;
      memset(&stream, 0, sizeof(stream));

      // In case lzham_z_ulong is 64-bits (argh I hate longs).
      if ((source_len | *pDest_len) > 0xFFFFFFFFU) 
         return LZHAM_Z_PARAM_ERROR;

      stream.next_in = pSource;
      stream.avail_in = (uint)source_len;
      stream.next_out = pDest;
      stream.avail_out = (uint)*pDest_len;

      status = lzham_lib_z_inflateInit(&stream);
      if (status != LZHAM_Z_OK)
         return status;

      status = lzham_lib_z_inflate(&stream, LZHAM_Z_FINISH);
      if (status != LZHAM_Z_STREAM_END)
      {
         lzham_lib_z_inflateEnd(&stream);
         return ((status == LZHAM_Z_BUF_ERROR) && (!stream.avail_in)) ? LZHAM_Z_DATA_ERROR : status;
      }
      *pDest_len = stream.total_out;

      return lzham_lib_z_inflateEnd(&stream);
   }